

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<float> __thiscall
vkt::shaderexecutor::Functions::Dot<3>::doExpand(Dot<3> *this,ExpandContext *param_1,ArgExprs *args)

{
  long in_RCX;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *pSVar1;
  SharedPtrStateBase *extraout_RDX_00;
  int iVar2;
  ExprP<float> EVar3;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_80;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_70;
  long local_60;
  long local_58;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_50;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_40;
  
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_70,(int)in_RCX);
  local_60 = in_RCX + 0x10;
  local_58 = in_RCX;
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_80,(int)local_60);
  shaderexecutor::operator*
            ((shaderexecutor *)this,(ExprP<float> *)&local_70,(ExprP<float> *)&local_80);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_80);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_70);
  pSVar1 = extraout_RDX;
  for (iVar2 = 1; iVar2 != 3; iVar2 = iVar2 + 1) {
    ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
              ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_40,(int)local_58);
    ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
              ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_50,(int)local_60);
    shaderexecutor::operator*
              ((shaderexecutor *)&local_80,(ExprP<float> *)&local_40,(ExprP<float> *)&local_50);
    shaderexecutor::operator+
              ((shaderexecutor *)&local_70,(ExprP<float> *)this,(ExprP<float> *)&local_80);
    de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::operator=
              ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)this,&local_70);
    de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_70);
    de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_80);
    de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_50);
    de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_40);
    pSVar1 = extraout_RDX_00;
  }
  EVar3.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state =
       pSVar1;
  EVar3.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr =
       (Expr<float> *)this;
  return (ExprP<float>)
         EVar3.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>;
}

Assistant:

ExprP<float>	doExpand	(ExpandContext&, const ArgExprs& args) const
	{
		ExprP<float> val = args.a[0] * args.b[0];

		for (int ndx = 1; ndx < Size; ++ndx)
			val = val + args.a[ndx] * args.b[ndx];

		return val;
	}